

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_thread.cpp
# Opt level: O2

void __thiscall tls_functor::operator()(tls_functor *this)

{
  thread_specific_ptr<tls_object> *this_00;
  long lVar1;
  tls_object *new_val;
  ostream *poVar2;
  runtime_error *prVar3;
  int iVar4;
  int iVar5;
  string asStack_1b8 [32];
  ostringstream oss;
  
  this_00 = this->ptr;
  lVar1 = (**(code **)(*(long *)*this_00 + 0x10))();
  if (*(long *)(lVar1 + 8) == 0) {
    new_val = (tls_object *)operator_new(4);
    new_val->counter = 0;
    booster::thread_specific_ptr<tls_object>::reset(this_00,new_val);
  }
  iVar4 = 0;
  do {
    if (iVar4 == 10) {
      lVar1 = (**(code **)(*(long *)*this_00 + 0x10))();
      if (**(int **)(lVar1 + 8) == 10) {
        return;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar2 = std::operator<<((ostream *)&oss,"Error ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x6b);
      std::operator<<(poVar2," p->counter == 10");
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(prVar3,asStack_1b8);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar1 = (**(code **)(*(long *)*this_00 + 0x10))();
    iVar5 = **(int **)(lVar1 + 8);
    booster::ptime::millisleep(0x19);
    lVar1 = (**(code **)(*(long *)*this_00 + 0x10))();
    **(int **)(lVar1 + 8) = iVar5 + 1;
    lVar1 = (**(code **)(*(long *)*this_00 + 0x10))();
    iVar5 = iVar4 + 1;
    iVar4 = **(int **)(lVar1 + 8);
  } while (**(int **)(lVar1 + 8) == iVar5);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar2 = std::operator<<((ostream *)&oss,"Error ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/thread/test/test_thread.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x69);
  std::operator<<(poVar2," p->counter == i+1");
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(prVar3,asStack_1b8);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void operator()() const
	{
		try {
			booster::thread_specific_ptr<tls_object> &p=*ptr;
			if(p.get()==0)
				p.reset(new tls_object());
			for(int i=0;i<10;i++) {
				int v1 = p->counter;
				booster::ptime::millisleep(25);
				p->counter = v1+1;
				TEST(p->counter == i+1);
			}
			TEST(p->counter == 10);
		}
		catch(...) {
			tls_ok=false;
		}
	}